

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O1

void __thiscall FileSendSession::~FileSendSession(FileSendSession *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  char cVar4;
  
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_0014b8e0;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::fstream::close();
  }
  pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
  paVar1 = &(this->file).m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->error).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->error,(_Any_data *)&this->error,__destroy_functor);
  }
  p_Var3 = (this->success).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->success,(_Any_data *)&this->success,__destroy_functor);
  }
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> = 0x14ba48;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108 =
       0x14ba98;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x10 =
       0x14ba70;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->stream).super_basic_fstream<char,_std::char_traits<char>_>._M_filebuf);
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> = 0x14bb38;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108 =
       0x14bb60;
  *(undefined8 *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x8 = 0;
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x108);
  pcVar2 = (this->buff).buf._M_dataplus._M_p;
  paVar1 = &(this->buff).buf.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Subscriber::~Subscriber(&this->super_Subscriber);
  return;
}

Assistant:

FileSendSession::~FileSendSession() {
  if (stream.is_open())
    stream.close();
}